

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gguf.cpp
# Opt level: O2

int8_t gguf_get_val_i8(gguf_context *ctx,int64_t key_id)

{
  pointer pgVar1;
  size_t sVar2;
  char *pcVar3;
  int line;
  
  if (-1 < key_id) {
    pgVar1 = (ctx->kv).super__Vector_base<gguf_kv,_std::allocator<gguf_kv>_>._M_impl.
             super__Vector_impl_data._M_start;
    if (key_id < ((long)(ctx->kv).super__Vector_base<gguf_kv,_std::allocator<gguf_kv>_>._M_impl.
                        super__Vector_impl_data._M_finish - (long)pgVar1) / 0x58) {
      sVar2 = gguf_kv::get_ne(pgVar1 + key_id);
      if (sVar2 == 1) {
        pcVar3 = gguf_kv::get_val<signed_char>
                           ((ctx->kv).super__Vector_base<gguf_kv,_std::allocator<gguf_kv>_>._M_impl.
                            super__Vector_impl_data._M_start + key_id,0);
        return *pcVar3;
      }
      pcVar3 = "ctx->kv[key_id].get_ne() == 1";
      line = 0x32a;
      goto LAB_0013f608;
    }
  }
  pcVar3 = "key_id >= 0 && key_id < gguf_get_n_kv(ctx)";
  line = 0x329;
LAB_0013f608:
  ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/ggml/src/gguf.cpp"
             ,line,"GGML_ASSERT(%s) failed",pcVar3);
}

Assistant:

int8_t gguf_get_val_i8(const struct gguf_context * ctx, int64_t key_id) {
    GGML_ASSERT(key_id >= 0 && key_id < gguf_get_n_kv(ctx));
    GGML_ASSERT(ctx->kv[key_id].get_ne() == 1);
    return ctx->kv[key_id].get_val<int8_t>();
}